

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::TextureImmutableLevelsCase::test
          (TextureImmutableLevelsCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  TestLog *pTVar1;
  GLenum GVar2;
  GLsizei depth;
  allocator<char> local_f9;
  GLuint textureID;
  GLuint textureID_1;
  ResultCollector *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  string local_a8;
  code *local_88;
  GLenum local_80;
  ScopedLogSection section_1;
  string local_70;
  ScopedLogSection section;
  
  pTVar1 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_f0 = result;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"Initial",(allocator<char> *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"Initial",(allocator<char> *)&local_70);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_a8,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  StateQueryUtil::verifyStateTextureParamInteger
            (local_f0,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0,
             (this->super_TextureTest).m_type);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  if (((this->super_TextureTest).m_target | 2) == 0x9102) {
    pTVar1 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"Level",(allocator<char> *)&section);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"Level",(allocator<char> *)&local_e8);
    tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar1,&local_a8,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    textureID = 0;
    glu::CallLogWrapper::glGenTextures(gl,1,&textureID);
    glu::CallLogWrapper::glBindTexture(gl,(this->super_TextureTest).m_target,textureID);
    GVar2 = glu::CallLogWrapper::glGetError(gl);
    if (GVar2 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,"Got Error ",(allocator<char> *)&textureID_1);
      local_88 = glu::getErrorName;
      local_80 = GVar2;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_70,&local_88);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                     &local_e8,&local_70);
      std::operator+(&local_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                     ": ");
      std::operator+(&local_a8,&local_c8,"glBindTexture");
      tcu::ResultCollector::fail(local_f0,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&section);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_e8);
    }
    GVar2 = (this->super_TextureTest).m_target;
    if (GVar2 == 0x9102) {
      glu::CallLogWrapper::glTexStorage3DMultisample(gl,0x9102,2,0x8051,0x40,0x40,2,'\0');
    }
    else if (GVar2 == 0x9100) {
      glu::CallLogWrapper::glTexStorage2DMultisample(gl,0x9100,2,0x8051,0x40,0x40,'\0');
    }
    GVar2 = glu::CallLogWrapper::glGetError(gl);
    if (GVar2 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,"Got Error ",(allocator<char> *)&textureID_1);
      local_88 = glu::getErrorName;
      local_80 = GVar2;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_70,&local_88);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                     &local_e8,&local_70);
      std::operator+(&local_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                     ": ");
      std::operator+(&local_a8,&local_c8,"glTexStorage");
      tcu::ResultCollector::fail(local_f0,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&section);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_e8);
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (local_f0,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,1,
               (this->super_TextureTest).m_type);
    glu::CallLogWrapper::glDeleteTextures(gl,1,&textureID);
    GVar2 = glu::CallLogWrapper::glGetError(gl);
    if (GVar2 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,"Got Error ",(allocator<char> *)&textureID_1);
      local_88 = glu::getErrorName;
      local_80 = GVar2;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_70,&local_88);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                     &local_e8,&local_70);
      std::operator+(&local_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                     ": ");
      std::operator+(&local_a8,&local_c8,"glDeleteTextures");
      tcu::ResultCollector::fail(local_f0,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&section);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_e8);
    }
    tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  }
  else {
    for (textureID = 1; (int)textureID < 8; textureID = textureID + 1) {
      pTVar1 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"Levels",(allocator<char> *)&local_e8);
      de::toString<int>((string *)&section,(int *)&textureID);
      std::operator+(&local_c8,"Levels = ",(string *)&section);
      tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar1,&local_a8,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&section);
      std::__cxx11::string::~string((string *)&local_a8);
      textureID_1 = 0;
      glu::CallLogWrapper::glGenTextures(gl,1,&textureID_1);
      glu::CallLogWrapper::glBindTexture(gl,(this->super_TextureTest).m_target,textureID_1);
      GVar2 = glu::CallLogWrapper::glGetError(gl);
      if (GVar2 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e8,"Got Error ",&local_f9);
        local_88 = glu::getErrorName;
        local_80 = GVar2;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_70,&local_88);
        std::operator+((string *)&section,&local_e8,&local_70);
        std::operator+(&local_c8,(string *)&section,": ");
        std::operator+(&local_a8,&local_c8,"glBindTexture");
        tcu::ResultCollector::fail(local_f0,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&section);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_e8);
      }
      GVar2 = (this->super_TextureTest).m_target;
      if (GVar2 == 0xde1) {
LAB_006c7a33:
        glu::CallLogWrapper::glTexStorage2D(gl,GVar2,textureID,0x8051,0x40,0x40);
      }
      else {
        depth = 0x40;
        if (GVar2 != 0x806f) {
          if (GVar2 == 0x9009) {
            depth = 0xc;
          }
          else if (GVar2 != 0x8c1a) {
            if (GVar2 == 0x8513) goto LAB_006c7a33;
            goto LAB_006c7a6b;
          }
        }
        glu::CallLogWrapper::glTexStorage3D(gl,GVar2,textureID,0x8051,0x40,0x40,depth);
      }
LAB_006c7a6b:
      GVar2 = glu::CallLogWrapper::glGetError(gl);
      if (GVar2 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e8,"Got Error ",&local_f9);
        local_88 = glu::getErrorName;
        local_80 = GVar2;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_70,&local_88);
        std::operator+((string *)&section,&local_e8,&local_70);
        std::operator+(&local_c8,(string *)&section,": ");
        std::operator+(&local_a8,&local_c8,"glTexStorage");
        tcu::ResultCollector::fail(local_f0,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&section);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_e8);
      }
      StateQueryUtil::verifyStateTextureParamInteger
                (local_f0,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 textureID,(this->super_TextureTest).m_type);
      glu::CallLogWrapper::glDeleteTextures(gl,1,&textureID_1);
      GVar2 = glu::CallLogWrapper::glGetError(gl);
      if (GVar2 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e8,"Got Error ",&local_f9);
        local_88 = glu::getErrorName;
        local_80 = GVar2;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_70,&local_88);
        std::operator+((string *)&section,&local_e8,&local_70);
        std::operator+(&local_c8,(string *)&section,": ");
        std::operator+(&local_a8,&local_c8,"glDeleteTextures");
        tcu::ResultCollector::fail(local_f0,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&section);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_e8);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&section_1);
    }
  }
  return;
}

Assistant:

void TextureImmutableLevelsCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, 0, m_type);
	}

	if (m_target == GL_TEXTURE_2D_MULTISAMPLE		||
		m_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		// no levels
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Level", "Level");
		GLuint						textureID	= 0;

		gl.glGenTextures(1, &textureID);
		gl.glBindTexture(m_target, textureID);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindTexture");

		if (m_target == GL_TEXTURE_2D_MULTISAMPLE)
			gl.glTexStorage2DMultisample(m_target, 2, GL_RGB8, 64, 64, GL_FALSE);
		else if (m_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
			gl.glTexStorage3DMultisample(m_target, 2, GL_RGB8, 64, 64, 2, GL_FALSE);
		else
			DE_ASSERT(false);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexStorage");

		verifyStateTextureParamInteger(result, gl, m_target, m_pname, 1, m_type);

		gl.glDeleteTextures(1, &textureID);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glDeleteTextures");
	}
	else
	{
		for (int level = 1; level <= 7; ++level)
		{
			const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Levels", "Levels = " + de::toString(level));
			GLuint						textureID	= 0;

			gl.glGenTextures(1, &textureID);
			gl.glBindTexture(m_target, textureID);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindTexture");

			if (m_target == GL_TEXTURE_2D || m_target == GL_TEXTURE_CUBE_MAP)
				gl.glTexStorage2D(m_target, level, GL_RGB8, 64, 64);
			else if (m_target == GL_TEXTURE_2D_ARRAY || m_target == GL_TEXTURE_3D)
				gl.glTexStorage3D(m_target, level, GL_RGB8, 64, 64, 64);
			else if (m_target == GL_TEXTURE_CUBE_MAP_ARRAY)
				gl.glTexStorage3D(m_target, level, GL_RGB8, 64, 64, 6 * 2);
			else
				DE_ASSERT(false);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexStorage");

			verifyStateTextureParamInteger(result, gl, m_target, m_pname, level, m_type);

			gl.glDeleteTextures(1, &textureID);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glDeleteTextures");
		}
	}
}